

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O3

bool __thiscall
ON_CompressedBuffer::Compress
          (ON_CompressedBuffer *this,size_t sizeof__inbuffer,void *inbuffer,int sizeof_element)

{
  bool bVar1;
  bool bVar2;
  endian eVar3;
  ON__UINT32 OVar4;
  void *pvVar5;
  size_t sz;
  ON_CompressedBufferHelper *this_00;
  ON_CompressedBuffer *this_01;
  ON_CompressedBufferHelper helper;
  ON_CompressedBufferHelper local_4098;
  
  this_00 = &local_4098;
  if (this->m_buffer_compressed != (void *)0x0) {
    onfree(this->m_buffer_compressed);
  }
  this->m_buffer_compressed_capacity = 0;
  this->m_buffer_compressed = (void *)0x0;
  this->m_crc_uncompressed = 0;
  this->m_crc_compressed = 0;
  this->m_method = 0;
  this->m_sizeof_element = 0;
  this->m_sizeof_uncompressed = 0;
  this->m_sizeof_compressed = 0;
  if (sizeof__inbuffer != 0 && inbuffer == (void *)0x0) {
    return false;
  }
  if (sizeof__inbuffer == 0) {
    return true;
  }
  if (sizeof__inbuffer >> 0x20 != 0) {
    return false;
  }
  this->m_sizeof_uncompressed = sizeof__inbuffer;
  memset(&local_4098,0,0x4068);
  local_4098.m_action = 1;
  bVar1 = false;
  if ((((uint)sizeof_element < 9) && (bVar1 = false, (0x114U >> (sizeof_element & 0x1fU) & 1) != 0))
     && (bVar1 = false, (int)((sizeof__inbuffer & 0xffffffff) % (ulong)(uint)sizeof_element) == 0))
  {
    this->m_sizeof_element = sizeof_element;
    eVar3 = ON::Endian();
    if (eVar3 == big_endian) {
      this_00 = (ON_CompressedBufferHelper *)
                (long)(int)(sizeof__inbuffer / (ulong)(long)this->m_sizeof_element);
      ON_BinaryArchive::ToggleByteOrder
                ((size_t)this_00,(long)this->m_sizeof_element,inbuffer,inbuffer);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  this->m_method = (uint)(sizeof__inbuffer >= 0x81);
  if (sizeof__inbuffer < 0x81) {
LAB_0068e8ae:
    bVar2 = false;
  }
  else {
    bVar2 = CompressionInit((ON_CompressedBuffer *)this_00,&local_4098);
    if (!bVar2) {
      CompressionEnd((ON_CompressedBuffer *)this_00,&local_4098);
      this->m_method = 0;
      goto LAB_0068e8ae;
    }
    pvVar5 = onmalloc(sizeof__inbuffer >> 2);
    this->m_buffer_compressed = pvVar5;
    this_01 = this;
    sz = DeflateHelper(this,&local_4098,sizeof__inbuffer,inbuffer);
    CompressionEnd(this_01,&local_4098);
    if ((sz == 0) || (sz != this->m_sizeof_compressed)) {
      if (this->m_buffer_compressed != (void *)0x0) {
        onfree(this->m_buffer_compressed);
      }
      this->m_buffer_compressed_capacity = 0;
      this->m_buffer_compressed = (void *)0x0;
      this->m_crc_uncompressed = 0;
      this->m_crc_compressed = 0;
      this->m_method = 0;
      this->m_sizeof_element = 0;
      this->m_sizeof_uncompressed = 0;
      this->m_sizeof_compressed = 0;
      goto LAB_0068e8ae;
    }
    if (sz * 3 < this->m_buffer_compressed_capacity * 2) {
      this->m_buffer_compressed_capacity = sz;
      pvVar5 = onrealloc(this->m_buffer_compressed,sz);
      this->m_buffer_compressed = pvVar5;
    }
    bVar2 = true;
    if (this->m_method != 0) goto LAB_0068e8da;
  }
  pvVar5 = onmalloc(sizeof__inbuffer);
  this->m_buffer_compressed = pvVar5;
  if (pvVar5 != (void *)0x0) {
    this->m_sizeof_compressed = sizeof__inbuffer;
    this->m_buffer_compressed_capacity = sizeof__inbuffer;
    memcpy(pvVar5,inbuffer,sizeof__inbuffer);
    bVar2 = true;
  }
LAB_0068e8da:
  if (bVar1) {
    ON_BinaryArchive::ToggleByteOrder
              ((long)(int)(sizeof__inbuffer / (ulong)(long)this->m_sizeof_element),
               (long)this->m_sizeof_element,inbuffer,inbuffer);
  }
  if (bVar2 != false) {
    OVar4 = ON_CRC32(0,sizeof__inbuffer,inbuffer);
    this->m_crc_uncompressed = OVar4;
    OVar4 = ON_CRC32(0,this->m_sizeof_compressed,this->m_buffer_compressed);
    this->m_crc_compressed = OVar4;
  }
  return bVar2;
}

Assistant:

bool ON_CompressedBuffer::Compress(
        size_t sizeof__inbuffer,  // sizeof uncompressed input data
        const void* inbuffer,     // uncompressed input data
        int sizeof_element
        )
{
  Destroy();

  //size_t compressed_size = 0;
  bool rc = false;

  if ( sizeof__inbuffer > 0 && 0 == inbuffer )
    return false;

  if ( 0 == sizeof__inbuffer )
    return true;

  if (sizeof__inbuffer > UINT32_MAX)
    return false;

  // number of bytes of uncompressed data
  m_sizeof_uncompressed = sizeof__inbuffer;

  ON_CompressedBufferHelper helper;
  memset(&helper,0,sizeof(helper));
  helper.m_action = 1;

  bool bToggleByteOrder = false;
  switch(sizeof_element)
  {
  case 2:
  case 4:
  case 8:
    if ( 0 == (sizeof__inbuffer%sizeof_element) )
    {
      m_sizeof_element = sizeof_element;
      bToggleByteOrder = (ON::endian::big_endian == ON::Endian());
    }
    break;
  };

  if ( bToggleByteOrder ) 
  {
    ON_BinaryFile::ToggleByteOrder( 
      (int)(sizeof__inbuffer/m_sizeof_element), 
      m_sizeof_element, 
      inbuffer, 
      (void*)inbuffer
      );
  }

  m_method = (sizeof__inbuffer > 128) ? 1 : 0;
  if ( m_method ) 
  {
    if ( !CompressionInit(&helper) ) 
    {
      CompressionEnd(&helper);
      m_method = 0;
    }
    else
    {
      m_buffer_compressed = onmalloc(sizeof__inbuffer/4);
      size_t sizeof_compressed = DeflateHelper( &helper, sizeof__inbuffer, inbuffer );
      CompressionEnd(&helper);
      if ( sizeof_compressed > 0 && sizeof_compressed == m_sizeof_compressed )
      {
        rc = true;
        if ( 2*m_buffer_compressed_capacity > 3*m_sizeof_compressed )
        {
          // release memory we don't need
          m_buffer_compressed_capacity = m_sizeof_compressed;
          m_buffer_compressed = onrealloc(m_buffer_compressed,m_buffer_compressed_capacity);
        }
      }
      else
      {
        Destroy();
        m_method = 0;
      }
    }
  }

  if ( 0 ==  m_method )
  {
    // uncompressed
    m_buffer_compressed = onmalloc(sizeof__inbuffer);
    if ( m_buffer_compressed )
    {
      m_sizeof_compressed = sizeof__inbuffer;
      m_buffer_compressed_capacity = sizeof__inbuffer;
      memcpy(m_buffer_compressed,inbuffer,sizeof__inbuffer);
      rc = true;
    }
  }

  if ( bToggleByteOrder ) 
  {
    ON_BinaryFile::ToggleByteOrder( 
      (int)(sizeof__inbuffer/m_sizeof_element), 
      m_sizeof_element, 
      inbuffer, 
      (void*)inbuffer
      );
  }

  if (rc)
  {
    m_crc_uncompressed = ON_CRC32( 0, sizeof__inbuffer, inbuffer );
    m_crc_compressed   = ON_CRC32( 0, m_sizeof_compressed, m_buffer_compressed );
  }

  return rc;
}